

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeitems.cpp
# Opt level: O2

int AF_A_RemoveForceField(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  short sVar2;
  DObject *this;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  char *__assertion;
  DObject *this_00;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054e792;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_0054e6a5:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar5 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054e792;
        }
      }
      if (numparam == 1) goto LAB_0054e722;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054e782;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar5 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar5) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054e792;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054e782;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054e722:
        this_00[9].field_0x24 = this_00[9].field_0x24 & 0xfe;
        lVar3 = *(long *)&this_00[6].ObjectFlags;
        sVar2 = *(short *)(lVar3 + 0x196);
        for (lVar6 = 0; lVar6 < sVar2; lVar6 = lVar6 + 1) {
          lVar4 = *(long *)(*(long *)(lVar3 + 0x198) + lVar6 * 8);
          if ((*(long *)(lVar4 + 0x80) != 0) && (*(int *)(lVar4 + 0x28) == 0x21)) {
            *(uint *)(lVar4 + 0x20) = *(uint *)(lVar4 + 0x20) & 0xffff7ffe;
            *(undefined4 *)(lVar4 + 0x28) = 0;
            *(undefined4 *)(*(long *)(lVar4 + 0x48) + 0x60) = 0;
            *(undefined4 *)(*(long *)(lVar4 + 0x50) + 0x60) = 0;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054e792;
    }
    if (this_00 == (DObject *)0x0) goto LAB_0054e6a5;
  }
LAB_0054e782:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054e792:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                ,0x1a,"int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveForceField)
{
	PARAM_ACTION_PROLOGUE;

	self->flags &= ~MF_SPECIAL;

	for (int i = 0; i < self->Sector->linecount; ++i)
	{
		line_t *line = self->Sector->lines[i];
		if (line->backsector != NULL && line->special == ForceField)
		{
			line->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
			line->special = 0;
			line->sidedef[0]->SetTexture(side_t::mid, FNullTextureID());
			line->sidedef[1]->SetTexture(side_t::mid, FNullTextureID());
		}
	}
	return 0;
}